

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O3

void __thiscall
Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Reset
          (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this)

{
  BigBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  void *pvVar5;
  BigBlock *pBVar6;
  
  bVar3 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::ValidThreadAccess((this->super_ArenaData).pageAllocator);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.h"
                       ,0xb2,"(this->pageAllocator->ValidThreadAccess())",
                       "Arena allocation should only be used by a single thread");
    if (!bVar3) goto LAB_00473213;
    *puVar4 = 0;
  }
  if ((this->super_ArenaData).lockBlockList == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.h"
                       ,0xb3,"(!lockBlockList)","!lockBlockList");
    if (!bVar3) goto LAB_00473213;
    *puVar4 = 0;
  }
  pvVar5 = InPlaceFreeListPolicy::Reset(this->freeList);
  this->freeList = pvVar5;
  LogReset(this);
  ArenaMemoryTracking::ReportFreeAll(&this->super_Allocator);
  if (this->blockState != 1) {
    FullReset(this);
    return;
  }
  pBVar6 = (this->super_ArenaData).bigBlocks;
  if ((((pBVar6 == (BigBlock *)0x0) || ((this->super_ArenaData).fullBlocks != (BigBlock *)0x0)) ||
      ((this->super_ArenaData).mallocBlocks != (ArenaMemoryBlock *)0x0)) ||
     ((pBVar6->super_ArenaMemoryBlock).field_0.next != (ArenaMemoryBlock *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.h"
                       ,0xbe,
                       "(this->bigBlocks != nullptr && this->fullBlocks == nullptr && this->mallocBlocks == nullptr && this->bigBlocks->nextBigBlock == nullptr)"
                       ,
                       "this->bigBlocks != nullptr && this->fullBlocks == nullptr && this->mallocBlocks == nullptr && this->bigBlocks->nextBigBlock == nullptr"
                      );
    if (!bVar3) goto LAB_00473213;
    *puVar4 = 0;
  }
  if (this->largestHole != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.h"
                       ,0xbf,"(this->largestHole == 0)","this->largestHole == 0");
    if (!bVar3) goto LAB_00473213;
    *puVar4 = 0;
  }
  pBVar6 = (this->super_ArenaData).bigBlocks;
  if ((long)&pBVar6[1].super_ArenaMemoryBlock.field_0 + (pBVar6->super_ArenaMemoryBlock).nbytes !=
      ((ulong)(this->cacheBlockEnd).ptr & 0xfffffffffffffffc)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.h"
                       ,0xc0,"(cacheBlockEnd == bigBlocks->GetBytes() + bigBlocks->nbytes)",
                       "cacheBlockEnd == bigBlocks->GetBytes() + bigBlocks->nbytes");
    if (!bVar3) goto LAB_00473213;
    *puVar4 = 0;
    pBVar6 = (this->super_ArenaData).bigBlocks;
  }
  pBVar1 = (BigBlock *)(this->super_ArenaData).cacheBlockCurrent;
  if ((pBVar1 < pBVar6 + 1) ||
     ((BigBlock *)((ulong)(this->cacheBlockEnd).ptr & 0xfffffffffffffffc) < pBVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.h"
                       ,0xc1,
                       "(bigBlocks->GetBytes() <= cacheBlockCurrent && cacheBlockCurrent <= cacheBlockEnd)"
                       ,
                       "bigBlocks->GetBytes() <= cacheBlockCurrent && cacheBlockCurrent <= cacheBlockEnd"
                      );
    if (!bVar3) {
LAB_00473213:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pBVar6 = (this->super_ArenaData).bigBlocks;
  }
  (this->super_ArenaData).cacheBlockCurrent = (char *)(pBVar6 + 1);
  LogRealAlloc(this,pBVar6->allocation->pageCount << 0xc);
  return;
}

Assistant:

void Reset()
    {
        ASSERT_THREAD();
        Assert(!lockBlockList);

        freeList = TFreeListPolicy::Reset(freeList);
#ifdef PROFILE_MEM
        LogReset();
#endif

        ArenaMemoryTracking::ReportFreeAll(this);

        if (this->blockState == 1)
        {
            Assert(this->bigBlocks != nullptr && this->fullBlocks == nullptr && this->mallocBlocks == nullptr && this->bigBlocks->nextBigBlock == nullptr);
            Assert(this->largestHole == 0);
            Assert(cacheBlockEnd == bigBlocks->GetBytes() + bigBlocks->nbytes);
            Assert(bigBlocks->GetBytes() <= cacheBlockCurrent && cacheBlockCurrent <= cacheBlockEnd);
            cacheBlockCurrent = bigBlocks->GetBytes();
#ifdef PROFILE_MEM
            LogRealAlloc(bigBlocks->allocation->GetSize() + sizeof(PageAllocation));
#endif
            return;
        }
        FullReset();
    }